

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

void __thiscall
OStream_WriteUnsigned_Test::~OStream_WriteUnsigned_Test(OStream_WriteUnsigned_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (OStream, WriteUnsigned) {
    test_ostream str;

    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"123"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"4"s}), std::size_t{1}));

    str << 1234U;
    str.flush ();
}